

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

void __thiscall
glu::sl::ShaderParser::parsePipelineProgram(ShaderParser *this,ProgramSpecification *program)

{
  Token TVar1;
  deUint32 dVar2;
  undefined8 extraout_RAX;
  ShaderParser *this_00;
  ProgramSpecification *this_01;
  ulong uVar3;
  string source;
  undefined1 local_b0 [28];
  undefined8 uStack_94;
  RequiredCapability local_88;
  ProgramSpecification *local_80;
  string local_78;
  ProgramSpecification *local_58;
  ProgramSpecification *local_50;
  vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *local_48;
  ProgramSpecification *local_40;
  ProgramSpecification *local_38;
  
  assumeToken(this,TOKEN_PIPELINE_PROGRAM);
  advanceToken(this);
  local_58 = (ProgramSpecification *)((program->sources).sources + 2);
  local_40 = (ProgramSpecification *)((program->sources).sources + 4);
  local_38 = (ProgramSpecification *)((program->sources).sources + 3);
  local_50 = (ProgramSpecification *)((program->sources).sources + 1);
  local_48 = &program->requiredExtensions;
  local_80 = program;
  while( true ) {
    TVar1 = this->m_curToken;
    uVar3 = (ulong)TVar1;
    if (0x36 < uVar3) break;
    if ((0x3800000030000U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 0x32) {
        local_b0._0_4_ = 3;
        local_b0._24_4_ = 0;
        uStack_94 = 0;
        local_b0._8_8_ = (pointer)0x0;
        local_b0._16_4_ = 0;
        local_b0._20_4_ = 0;
        local_88.enumName = 0;
        local_88.referenceValue = 0;
        parseRequirement(this,(CaseRequirement *)local_b0);
        if (local_b0._0_4_ != TYPE_EXTENSION) {
LAB_0089d8d7:
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "only extension requirements are allowed inside pipeline program","");
          parseError(this,&local_78);
          goto LAB_0089d904;
        }
        std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
        push_back(local_48,(value_type *)(local_b0 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_b0 + 8));
      }
      else {
        if (uVar3 != 0x36) break;
        advanceToken(this);
        dVar2 = parseShaderStageList(this);
        local_80->activeStages = dVar2;
      }
    }
    else {
      local_b0._0_8_ = local_b0 + 0x10;
      local_b0._8_8_ = (pointer)0x0;
      local_b0._16_4_ = local_b0._16_4_ & 0xffffff00;
      advanceToken(this);
      this_00 = (ShaderParser *)0x3;
      assumeToken(this,TOKEN_SHADER_SOURCE);
      parseShaderSource_abi_cxx11_(&local_78,this_00,(this->m_curTokenStr)._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)local_b0,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      advanceToken(this);
      if ((int)TVar1 < 0x2f) {
        this_01 = local_80;
        if ((TVar1 != TOKEN_VERTEX) && (this_01 = local_50, TVar1 != TOKEN_FRAGMENT))
        goto LAB_0089d8c1;
      }
      else {
        this_01 = local_38;
        if ((TVar1 != TOKEN_TESSELLATION_CONTROL) &&
           ((this_01 = local_40, TVar1 != TOKEN_TESSELLATION_EVALUATION &&
            (this_01 = local_58, TVar1 != TOKEN_GEOMETRY)))) {
LAB_0089d8c1:
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__throw_logic_error("basic_string::_M_construct null not valid");
          goto LAB_0089d8d7;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_01,(value_type *)local_b0);
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,CONCAT44(local_b0._20_4_,local_b0._16_4_) + 1);
      }
    }
  }
  if (TVar1 == TOKEN_END) {
    assumeToken(this,TOKEN_END);
    advanceToken(this);
    if (local_80->activeStages != 0) {
      return;
    }
  }
  else {
LAB_0089d904:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   "invalid pipeline program value: ",&this->m_curTokenStr);
    parseError(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  }
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"program pipeline object must have active stages","");
  parseError(this,(string *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,CONCAT44(local_b0._20_4_,local_b0._16_4_) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parsePipelineProgram (ProgramSpecification& program)
{
	advanceToken(TOKEN_PIPELINE_PROGRAM);

	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_ACTIVE_STAGES)
		{
			advanceToken();
			program.activeStages = parseShaderStageList();
		}
		else if (m_curToken == TOKEN_REQUIRE)
		{
			CaseRequirement requirement;
			parseRequirement(requirement);

			if (requirement.type == CaseRequirement::TYPE_EXTENSION)
				program.requiredExtensions.push_back(requirement.extension);
			else
				parseError("only extension requirements are allowed inside pipeline program");
		}
		else if (m_curToken == TOKEN_VERTEX						||
				 m_curToken == TOKEN_FRAGMENT					||
				 m_curToken == TOKEN_TESSELLATION_CONTROL		||
				 m_curToken == TOKEN_TESSELLATION_EVALUATION	||
				 m_curToken == TOKEN_GEOMETRY)
		{
			const Token	token = m_curToken;
			string		source;

			advanceToken();
			assumeToken(TOKEN_SHADER_SOURCE);
			source = parseShaderSource(m_curTokenStr.c_str());
			advanceToken();

			switch (token)
			{
				case TOKEN_VERTEX:					program.sources.sources[SHADERTYPE_VERTEX].push_back(source);					break;
				case TOKEN_FRAGMENT:				program.sources.sources[SHADERTYPE_FRAGMENT].push_back(source);					break;
				case TOKEN_TESSELLATION_CONTROL:	program.sources.sources[SHADERTYPE_TESSELLATION_CONTROL].push_back(source);		break;
				case TOKEN_TESSELLATION_EVALUATION:	program.sources.sources[SHADERTYPE_TESSELLATION_EVALUATION].push_back(source);	break;
				case TOKEN_GEOMETRY:				program.sources.sources[SHADERTYPE_GEOMETRY].push_back(source);					break;
				default:
					parseError(DE_FALSE);
			}
		}
		else
			parseError(string("invalid pipeline program value: " + m_curTokenStr));
	}
	advanceToken(TOKEN_END);

	if (program.activeStages == 0)
		parseError("program pipeline object must have active stages");
}